

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

void __thiscall
soplex::SLUFactor<double>::solve3right4update
          (SLUFactor<double> *this,SSVectorBase<double> *x,VectorBase<double> *y,
          VectorBase<double> *y2,SVectorBase<double> *b,SSVectorBase<double> *rhs,
          SSVectorBase<double> *rhs2)

{
  int rn3;
  int iVar1;
  int iVar2;
  int iVar3;
  int *ridx;
  int *ridx2;
  int *ridx3;
  Tolerances *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pdVar4;
  pointer pdVar5;
  int *piVar6;
  double *pdVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *rhs3;
  Real eps;
  Real RVar12;
  int iVar13;
  long lVar14;
  vector<double,_std::allocator<double>_> *__range2;
  vector<double,_std::allocator<double>_> *__range2_1;
  int f;
  double local_48;
  undefined8 uStack_40;
  
  (*this->solveTime->_vptr_Timer[3])();
  ridx = (this->ssvec).super_IdxSet.idx;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  iVar13 = (rhs->super_IdxSet).num;
  rhs->setupStatus = false;
  ridx2 = (rhs->super_IdxSet).idx;
  rn3 = (rhs2->super_IdxSet).num;
  rhs2->setupStatus = false;
  ridx3 = (rhs2->super_IdxSet).idx;
  this_00 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  this_01 = (this->super_CLUFactor<double>)._tolerances.
            super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      this_01->_M_use_count = this_01->_M_use_count + 1;
      UNLOCK();
    }
    else {
      this_01->_M_use_count = this_01->_M_use_count + 1;
    }
  }
  eps = Tolerances::epsilon(this_00);
  if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
  }
  SSVectorBase<double>::clear(x);
  pdVar4 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 != pdVar5) {
    memset(pdVar4,0,(long)pdVar5 - (long)pdVar4 & 0xfffffffffffffff8);
  }
  pdVar4 = (y2->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar5 = (y2->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 != pdVar5) {
    memset(pdVar4,0,(long)pdVar5 - (long)pdVar4 & 0xfffffffffffffff8);
  }
  this->usetup = true;
  SSVectorBase<double>::clear(&this->ssvec);
  iVar1 = b->memused;
  (this->ssvec).super_IdxSet.num = 0;
  if (0 < (long)iVar1) {
    lVar14 = 0;
    do {
      iVar2 = *(int *)((long)&b->m_elem->idx + lVar14);
      local_48 = *(double *)((long)&b->m_elem->val + lVar14);
      uStack_40 = 0;
      RVar12 = Tolerances::epsilon((this->ssvec)._tolerances.
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      pdVar4 = (this->ssvec).super_VectorBase<double>.val.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start;
      if (ABS(local_48) <= RVar12) {
        pdVar4[iVar2] = 0.0;
      }
      else {
        pdVar4[iVar2] = local_48;
        piVar6 = (this->ssvec).super_IdxSet.idx;
        iVar3 = (this->ssvec).super_IdxSet.num;
        (this->ssvec).super_IdxSet.num = iVar3 + 1;
        piVar6[iVar3] = iVar2;
      }
      lVar14 = lVar14 + 0x10;
    } while ((long)iVar1 * 0x10 != lVar14);
  }
  (this->ssvec).setupStatus = true;
  if ((this->super_CLUFactor<double>).l.updateType == 0) {
    iVar1 = (this->ssvec).super_IdxSet.num;
    x->setupStatus = false;
    piVar6 = (x->super_IdxSet).idx;
    pdVar7 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar8 = (this->ssvec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar9 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    rhs->setupStatus = false;
    pdVar10 = (rhs->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    pdVar11 = (y2->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    rhs2->setupStatus = false;
    iVar13 = CLUFactor<double>::vSolveRight4update3
                       (&this->super_CLUFactor<double>,eps,pdVar7,piVar6,pdVar8,ridx,iVar1,pdVar9,
                        eps,pdVar10,ridx2,iVar13,pdVar11,eps,
                        (rhs2->super_VectorBase<double>).val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,ridx3,rn3,(double *)0x0,(int *)0x0,
                        (int *)0x0);
    x->setupStatus = false;
    (x->super_IdxSet).num = iVar13;
    SSVectorBase<double>::setup_and_assign<double>(&this->eta,x);
  }
  else {
    SSVectorBase<double>::clear(&this->forest);
    iVar1 = (this->ssvec).super_IdxSet.num;
    x->setupStatus = false;
    piVar6 = (x->super_IdxSet).idx;
    pdVar7 = (x->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pdVar8 = (this->ssvec).super_VectorBase<double>.val.
             super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
             _M_start;
    pdVar9 = (y->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    rhs->setupStatus = false;
    pdVar10 = (rhs->super_VectorBase<double>).val.
              super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
              _M_start;
    pdVar11 = (y2->val).super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start;
    rhs2->setupStatus = false;
    rhs3 = (rhs2->super_VectorBase<double>).val.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
    (this->forest).setupStatus = false;
    iVar13 = CLUFactor<double>::vSolveRight4update3
                       (&this->super_CLUFactor<double>,eps,pdVar7,piVar6,pdVar8,ridx,iVar1,pdVar9,
                        eps,pdVar10,ridx2,iVar13,pdVar11,eps,rhs3,ridx3,rn3,
                        (this->forest).super_VectorBase<double>.val.
                        super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,&f,(this->forest).super_IdxSet.idx);
    (x->super_IdxSet).num = iVar13;
    x->setupStatus = true;
    (this->forest).super_IdxSet.num = f;
    (this->forest).setupStatus = true;
  }
  rhs->setupStatus = true;
  rhs2->setupStatus = true;
  (this->ssvec).super_IdxSet.num = 0;
  (this->ssvec).setupStatus = true;
  this->solveCount = this->solveCount + 3;
  (*this->solveTime->_vptr_Timer[4])();
  return;
}

Assistant:

void SLUFactor<R>::solve3right4update(
   SSVectorBase<R>&       x,
   VectorBase<R>&        y,
   VectorBase<R>&        y2,
   const SVectorBase<R>& b,
   SSVectorBase<R>&       rhs,
   SSVectorBase<R>&       rhs2)
{

   solveTime->start();

   int  m;
   int  n;
   int  f;
   int* sidx = ssvec.altIndexMem();
   ssvec.setSize(0);
   ssvec.forceSetup();
   int  rsize = rhs.size();
   int* ridx = rhs.altIndexMem();
   int  rsize2 = rhs2.size();
   int* ridx2 = rhs2.altIndexMem();
   R epsilon = this->tolerances()->epsilon();

   x.clear();
   y.clear();
   y2.clear();
   usetup = true;
   ssvec = b;

   if(this->l.updateType == ETA)
   {
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    nullptr, nullptr, nullptr);
      x.setSize(m);
      //      x.forceSetup();
      x.unSetup();
      eta.setup_and_assign(x);
   }
   else
   {
      forest.clear();
      n = ssvec.size();
      m = this->vSolveRight4update3(epsilon,
                                    x.altValues(), x.altIndexMem(), ssvec.get_ptr(), sidx, n,
                                    y.get_ptr(), epsilon, rhs.altValues(), ridx, rsize,
                                    y2.get_ptr(), epsilon, rhs2.altValues(), ridx2, rsize2,
                                    forest.altValues(), &f, forest.altIndexMem());
      x.setSize(m);
      x.forceSetup();
      forest.setSize(f);
      forest.forceSetup();
   }

   rhs.forceSetup();
   rhs2.forceSetup();
   ssvec.setSize(0);
   ssvec.forceSetup();

   solveCount += 3;
   solveTime->stop();
}